

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

bool __thiscall covenant::CFG::isOneLevelIndirectionTerminal(CFG *this,Sym *s)

{
  bool bVar1;
  int iVar2;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *S;
  const_reference pvVar3;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *pvVar4;
  const_reference pvVar5;
  Sym *in_RSI;
  long in_RDI;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  int r;
  uint ri;
  int vv;
  bool is_term;
  int iVar6;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar8;
  bool local_1;
  
  bVar1 = Sym::isTerm((Sym *)0x216482);
  if (bVar1) {
    local_1 = true;
  }
  else {
    uVar8 = CONCAT13(1,(int3)in_stack_ffffffffffffffe4);
    iVar2 = Sym::symID(in_RSI);
    uVar7 = 0;
    while( true ) {
      S = (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)(ulong)uVar7;
      pvVar3 = std::
               vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             *)(in_RDI + 0x40),(long)iVar2);
      pvVar4 = (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
               std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                         (pvVar3);
      if (pvVar4 <= S) break;
      pvVar3 = std::
               vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             *)(in_RDI + 0x40),(long)iVar2);
      pvVar5 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
               operator[](pvVar3,(ulong)uVar7);
      iVar6 = pvVar5->rule;
      std::
      vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
      ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                    *)(in_RDI + 0x58),(long)iVar6);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)CONCAT44(uVar8,iVar2),
                 (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)CONCAT44(uVar7,iVar6));
      bVar1 = isAllTerminal(S);
      uVar8 = CONCAT13(((byte)((uint)uVar8 >> 0x18) & 1 & bVar1) != 0,(int3)uVar8);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector(S);
      uVar7 = uVar7 + 1;
    }
    local_1 = (bool)((byte)((uint)uVar8 >> 0x18) & 1);
  }
  return local_1;
}

Assistant:

bool isOneLevelIndirectionTerminal(const Sym &s) const
    {
      if (s.isTerm ()) 
        return true;
      else
      {
        bool is_term = true;
        int vv = s.symID();
        for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          is_term &= isAllTerminal(RHS); 
        }
        return is_term;
      }
    }